

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

void __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<false>_>::clock_keystate
          (fm_operator<ymfm::opn_registers_base<false>_> *this,uint32_t keystate)

{
  bool local_15;
  uint32_t keystate_local;
  fm_operator<ymfm::opn_registers_base<false>_> *this_local;
  
  local_15 = 1 < keystate;
  if (local_15) {
    __assert_fail("keystate == 0 || keystate == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/chips/ymfm/ymfm_fm.hpp"
                  ,0x266,
                  "void ymfm::fm_operator<ymfm::opn_registers_base<false>>::clock_keystate(uint32_t) [RegisterType = ymfm::opn_registers_base<false>]"
                 );
  }
  if (keystate != this->m_key_state) {
    this->m_key_state = (uint8_t)keystate;
    if (keystate == 0) {
      start_release(this);
    }
    else {
      start_attack(this,false);
    }
  }
  return;
}

Assistant:

void fm_operator<RegisterType>::clock_keystate(uint32_t keystate)
{
	assert(keystate == 0 || keystate == 1);

	// has the key changed?
	if ((keystate ^ m_key_state) != 0)
	{
		m_key_state = keystate;

		// if the key has turned on, start the attack
		if (keystate != 0)
		{
			// OPLL has a DP ("depress"?) state to bring the volume
			// down before starting the attack
			if (RegisterType::EG_HAS_DEPRESS && m_env_attenuation < 0x200)
				m_env_state = EG_DEPRESS;
			else
				start_attack();
		}

		// otherwise, start the release
		else
			start_release();
	}
}